

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void set_color_index_map_offset(MACROBLOCKD *xd,int plane,aom_reader *r)

{
  int in_ESI;
  MACROBLOCKD *in_RDI;
  MB_MODE_INFO *mbmi;
  Av1ColorMapParam params;
  short local_3c [2];
  short local_38 [22];
  int local_c;
  MACROBLOCKD *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  av1_get_block_dimensions
            ((*in_RDI->mi)->bsize,in_ESI,in_RDI,(int *)local_3c,(int *)local_38,(int *)0x0,
             (int *)0x0);
  local_8->color_index_map_offset[local_c] =
       local_8->color_index_map_offset[local_c] + local_3c[0] * local_38[0];
  return;
}

Assistant:

static inline void set_color_index_map_offset(MACROBLOCKD *const xd, int plane,
                                              aom_reader *r) {
  (void)r;
  Av1ColorMapParam params;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  av1_get_block_dimensions(mbmi->bsize, plane, xd, &params.plane_width,
                           &params.plane_height, NULL, NULL);
  xd->color_index_map_offset[plane] += params.plane_width * params.plane_height;
}